

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.cpp
# Opt level: O0

Error * ot::commissioner::PathExists(Error *__return_storage_ptr__,string *path)

{
  char *__name;
  int *piVar1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar2;
  format_args args;
  format_args args_00;
  format_args args_01;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  anon_class_1_0_00000001 local_2e2;
  v10 local_2e1;
  v10 *local_2e0;
  char *local_2d8;
  string local_2d0;
  anon_class_1_0_00000001 local_2aa;
  v10 local_2a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2a8;
  char *local_2a0;
  string local_298;
  anon_class_1_0_00000001 local_262;
  v10 local_261;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_260;
  char *local_258;
  string local_250;
  int local_22c;
  string *psStack_228;
  int err;
  string *path_local;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_218 [2];
  undefined1 local_208 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1f8;
  char *local_1f0;
  string *local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1e0;
  char *pcStack_1d8;
  string *local_1d0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_1c8 [2];
  undefined1 local_1b8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1a8;
  char *local_1a0;
  string *local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_190;
  char *pcStack_188;
  string *local_180;
  v10 *local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_170;
  v10 *local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_160;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int> *local_158 [3];
  undefined1 local_140 [16];
  v10 *local_130;
  char *local_128;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int> *local_120;
  v10 *local_118;
  char *pcStack_110;
  string *local_108;
  v10 *local_100;
  v10 **local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e8;
  char *pcStack_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  char *pcStack_c0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_b0;
  undefined1 *local_a8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_a0;
  undefined8 local_98;
  undefined1 *local_90;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_88;
  undefined1 *local_80;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_78;
  undefined8 local_70;
  undefined1 *local_68;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_60;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_58;
  v10 **local_50;
  v10 *local_48;
  char *pcStack_40;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int> **local_38;
  undefined1 *local_30;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int> **local_28;
  undefined8 local_20;
  undefined1 *local_18;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int> **local_10;
  
  psStack_228 = path;
  path_local = (string *)__return_storage_ptr__;
  __name = (char *)std::__cxx11::string::c_str();
  local_22c = access(__name,0);
  if (local_22c == 0) {
    Error::Error(__return_storage_ptr__);
  }
  else {
    piVar1 = __errno_location();
    if (*piVar1 == 2) {
      PathExists::anon_class_1_0_00000001::operator()(&local_262);
      local_170 = &local_260;
      local_178 = &local_261;
      bVar2 = ::fmt::v10::operator()(local_178);
      local_258 = (char *)bVar2.size_;
      local_260 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bVar2.data_;
      ::fmt::v10::detail::
      check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                ();
      local_190 = local_260;
      pcStack_188 = local_258;
      local_f0 = &local_190;
      local_1a8 = local_260;
      local_1a0 = local_258;
      local_198 = path;
      local_180 = &local_250;
      local_e8 = local_1a8;
      pcStack_e0 = local_1a0;
      local_1c8[0] = ::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string>
                               ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)path,(v10 *)&local_250,local_260);
      local_a8 = local_1b8;
      local_b0 = local_1c8;
      local_98 = 0xd;
      args.field_1.values_ = in_R9.values_;
      args.desc_ = (unsigned_long_long)local_b0;
      fmt.size_ = 0xd;
      fmt.data_ = local_1a0;
      local_a0 = local_b0;
      local_90 = local_a8;
      local_58 = local_b0;
      ::fmt::v10::vformat_abi_cxx11_(&local_250,(v10 *)local_1a8,fmt,args);
      Error::Error(__return_storage_ptr__,kNotFound,&local_250);
      std::__cxx11::string::~string((string *)&local_250);
    }
    else if (*piVar1 == 0x14) {
      PathExists::anon_class_1_0_00000001::operator()(&local_2aa);
      local_160 = &local_2a8;
      local_168 = &local_2a9;
      bVar2 = ::fmt::v10::operator()(local_168);
      local_2a0 = (char *)bVar2.size_;
      local_2a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bVar2.data_;
      ::fmt::v10::detail::
      check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                ();
      local_1e0 = local_2a8;
      pcStack_1d8 = local_2a0;
      local_d0 = &local_1e0;
      local_1f8 = local_2a8;
      local_1f0 = local_2a0;
      local_1e8 = path;
      local_1d0 = &local_298;
      local_c8 = local_1f8;
      pcStack_c0 = local_1f0;
      local_218[0] = ::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string>
                               ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)path,(v10 *)&local_298,local_2a8);
      local_80 = local_208;
      local_88 = local_218;
      local_70 = 0xd;
      args_00.field_1.values_ = in_R9.values_;
      args_00.desc_ = (unsigned_long_long)local_88;
      fmt_00.size_ = 0xd;
      fmt_00.data_ = local_1f0;
      local_78 = local_88;
      local_68 = local_80;
      local_60 = local_88;
      ::fmt::v10::vformat_abi_cxx11_(&local_298,(v10 *)local_1f8,fmt_00,args_00);
      Error::Error(__return_storage_ptr__,kNotFound,&local_298);
      std::__cxx11::string::~string((string *)&local_298);
    }
    else {
      PathExists::anon_class_1_0_00000001::operator()(&local_2e2);
      local_f8 = &local_2e0;
      local_100 = &local_2e1;
      bVar2 = ::fmt::v10::operator()(local_100);
      local_2d8 = (char *)bVar2.size_;
      local_2e0 = (v10 *)bVar2.data_;
      ::fmt::v10::detail::check_format_string<int_&,_FMT_COMPILE_STRING,_0>();
      local_120 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int> *
                  )__errno_location();
      local_118 = local_2e0;
      pcStack_110 = local_2d8;
      local_50 = &local_118;
      local_130 = local_2e0;
      local_128 = local_2d8;
      local_108 = &local_2d0;
      local_48 = local_130;
      pcStack_40 = local_128;
      local_158[0] = ::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,int>
                               (local_120,(v10 *)&local_2d0,(int *)local_2e0);
      local_30 = local_140;
      local_38 = local_158;
      local_20 = 1;
      args_01.field_1.values_ = in_R9.values_;
      args_01.desc_ = (unsigned_long_long)local_38;
      fmt_01.size_ = 1;
      fmt_01.data_ = local_128;
      local_28 = local_38;
      local_18 = local_30;
      local_10 = local_38;
      ::fmt::v10::vformat_abi_cxx11_(&local_2d0,local_130,fmt_01,args_01);
      Error::Error(__return_storage_ptr__,kNotFound,&local_2d0);
      std::__cxx11::string::~string((string *)&local_2d0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Error PathExists(std::string path)
{
    int err = access(path.c_str(), F_OK);
    if (err != 0)
    {
        switch (errno)
        {
        case ENOENT:
            return ERROR_NOT_FOUND("{} path does not exist", path);
        case ENOTDIR:
            return ERROR_NOT_FOUND("{} path is not a directory", path);
        default:
            return ERROR_NOT_FOUND("path error, errno = {}", errno);
        }
    }
    return ERROR_NONE;
}